

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O0

Value __thiscall xmrig::OclPlatform::toJSON(OclPlatform *this,Document *doc)

{
  bool bVar1;
  int __c;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Document *in_RSI;
  char *__s;
  String *in_RDI;
  Value VVar3;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  undefined8 in_stack_fffffffffffffea8;
  Type type;
  String *this_00;
  String *in_stack_fffffffffffffec8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_128;
  GenericStringRef<char> local_118;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffef8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  GenericStringRef<char> local_e8 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_c8;
  GenericStringRef<char> local_b8 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_98;
  GenericStringRef<char> local_88 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_68;
  GenericStringRef<char> local_58 [2];
  GenericStringRef<char> local_38;
  undefined1 local_21;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  
  this_00 = in_RDI;
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  bVar1 = isValid((OclPlatform *)in_RSI);
  type = (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  if (bVar1) {
    local_21 = 0;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_RDI,type);
    __s = "index";
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_38,(char (*) [6])0x27d57f);
    index((OclPlatform *)in_RSI,__s,__c);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)in_stack_ffffffffffffff10,(StringRefType *)in_stack_ffffffffffffff08,
               (unsigned_long)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    rapidjson::GenericStringRef<char>::GenericStringRef<8u>(local_58,(char (*) [8])"profile");
    profile((OclPlatform *)this_00);
    String::toJSON(in_stack_fffffffffffffec8,in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_ffffffffffffff10,(StringRefType *)in_stack_ffffffffffffff08,
              in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_68);
    String::~String(in_RDI);
    rapidjson::GenericStringRef<char>::GenericStringRef<8u>(local_88,(char (*) [8])0x27c3f7);
    version((OclPlatform *)this_00);
    String::toJSON(in_stack_fffffffffffffec8,in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_ffffffffffffff10,(StringRefType *)in_stack_ffffffffffffff08,
              in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_98);
    String::~String(in_RDI);
    rapidjson::GenericStringRef<char>::GenericStringRef<5u>(local_b8,(char (*) [5])"name");
    name((OclPlatform *)this_00);
    String::toJSON(in_stack_fffffffffffffec8,in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_ffffffffffffff10,(StringRefType *)in_stack_ffffffffffffff08,
              in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_c8);
    String::~String(in_RDI);
    rapidjson::GenericStringRef<char>::GenericStringRef<7u>(local_e8,(char (*) [7])"vendor");
    vendor((OclPlatform *)this_00);
    String::toJSON(in_stack_fffffffffffffec8,in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_ffffffffffffff10,(StringRefType *)in_stack_ffffffffffffff08,
              in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&stack0xffffffffffffff08);
    String::~String(in_RDI);
    rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_118,(char (*) [11])"extensions")
    ;
    extensions((OclPlatform *)this_00);
    String::toJSON(in_stack_fffffffffffffec8,in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_ffffffffffffff10,(StringRefType *)in_stack_ffffffffffffff08,
              in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_128);
    String::~String(in_RDI);
    uVar2 = extraout_RDX_00;
  }
  else {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_RDI,type);
    uVar2 = extraout_RDX;
  }
  VVar3.data_.s.str = (Ch *)uVar2;
  VVar3.data_.n = (Number)this_00;
  return (Value)VVar3.data_;
}

Assistant:

rapidjson::Value xmrig::OclPlatform::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    if (!isValid()) {
        return Value(kNullType);
    }

    Value out(kObjectType);
    out.AddMember("index",      static_cast<uint64_t>(index()), allocator);
    out.AddMember("profile",    profile().toJSON(doc), allocator);
    out.AddMember("version",    version().toJSON(doc), allocator);
    out.AddMember("name",       name().toJSON(doc), allocator);
    out.AddMember("vendor",     vendor().toJSON(doc), allocator);
    out.AddMember("extensions", extensions().toJSON(doc), allocator);

    return out;
}